

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O2

bool __thiscall TRM::TGAImage::scale(TGAImage *this,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uchar *__dest;
  size_t __n;
  int iVar16;
  
  puVar4 = this->data;
  if (puVar4 != (uchar *)0x0 && (0 < h && 0 < w)) {
    iVar1 = this->bytespp;
    __n = (size_t)iVar1;
    puVar7 = (uchar *)operator_new__((long)(h * w * iVar1));
    iVar8 = iVar1 * w;
    iVar2 = this->width;
    iVar3 = this->height;
    iVar11 = 0;
    iVar13 = 0;
    if (0 < iVar2) {
      iVar13 = iVar2;
    }
    iVar14 = 0;
    if (0 < iVar3) {
      iVar14 = iVar3;
    }
    iVar15 = 0;
    iVar6 = 0;
    for (iVar10 = 0; iVar10 != iVar14; iVar10 = iVar10 + 1) {
      lVar12 = (long)-iVar1;
      iVar5 = iVar2 - w;
      iVar16 = -iVar1;
      for (iVar9 = 0; iVar9 != iVar13; iVar9 = iVar9 + 1) {
        lVar12 = lVar12 + __n;
        __dest = puVar7 + (long)iVar16 + (long)iVar6 + __n;
        iVar5 = iVar5 + w;
        while (iVar2 <= iVar5) {
          memcpy(__dest,puVar4 + lVar12 + iVar11,__n);
          iVar16 = iVar16 + iVar1;
          __dest = __dest + __n;
          iVar5 = iVar5 - iVar2;
        }
      }
      iVar15 = iVar15 + h;
      while (iVar3 <= iVar15) {
        if (iVar3 * 2 <= iVar15) {
          memcpy(puVar7 + iVar6 + iVar8,puVar7 + iVar6,(long)iVar8);
        }
        iVar6 = iVar6 + iVar8;
        iVar15 = iVar15 - iVar3;
      }
      iVar11 = iVar11 + iVar2 * iVar1;
    }
    operator_delete__(puVar4);
    this->data = puVar7;
    this->width = w;
    this->height = h;
  }
  return puVar4 != (uchar *)0x0 && (0 < h && 0 < w);
}

Assistant:

bool TGAImage::scale(int w, int h) {
  if (w <= 0 || h <= 0 || !data) return false;
  unsigned char *tdata = new unsigned char[w * h * bytespp];
  int nscanline = 0;
  int oscanline = 0;
  int erry = 0;
  unsigned long nlinebytes = w * bytespp;
  unsigned long olinebytes = width * bytespp;
  for (int j = 0; j < height; j++) {
    int errx = width - w;
    int nx = -bytespp;
    int ox = -bytespp;
    for (int i = 0; i < width; i++) {
      ox += bytespp;
      errx += w;
      while (errx >= (int)width) {
        errx -= width;
        nx += bytespp;
        memcpy(tdata + nscanline + nx, data + oscanline + ox, bytespp);
      }
    }
    erry += h;
    oscanline += olinebytes;
    while (erry >= (int)height) {
      if (erry >= (int)height << 1)  // it means we jump over a scanline
        memcpy(tdata + nscanline + nlinebytes, tdata + nscanline, nlinebytes);
      erry -= height;
      nscanline += nlinebytes;
    }
  }
  delete[] data;
  data = tdata;
  width = w;
  height = h;
  return true;
}